

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O1

void __thiscall Window::_q_filesFound(Window *this)

{
  WindowPrivate *pWVar1;
  long lVar2;
  QString *pQVar3;
  Data *pDVar4;
  QFutureWatcher<QList<QString>_> *pQVar5;
  QtConcurrent *this_00;
  QStringList *this_01;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QString path;
  QList<QString> **in_stack_ffffffffffffff18;
  QArrayDataPointer<QString> local_e0;
  QArrayDataPointer<QString> local_c8;
  QArrayData *local_a8;
  char16_t *local_a0;
  qsizetype local_98;
  undefined1 local_90 [16];
  QString *pQStack_80;
  qsizetype local_78;
  QString local_68;
  QString local_48;
  undefined1 local_28 [8];
  undefined8 local_20;
  
  pWVar1 = (this->d).d;
  lVar2 = (pWVar1->imageFiles).d.size;
  QFuture<QList<QString>>::result<QList<QString>,void>
            ((QList<QString> *)&local_e0,&pWVar1->fileFuture);
  QList<QString>::operator+=(&((this->d).d)->imageFiles,(QList<QString> *)&local_e0);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_e0);
  if (lVar2 == 0) {
    WindowPrivate::loadImages((this->d).d);
  }
  pWVar1 = (this->d).d;
  if ((pWVar1->imageLocations).d.size != 0) {
    pQVar3 = (pWVar1->imageLocations).d.ptr;
    local_a8 = &((pQVar3->d).d)->super_QArrayData;
    local_a0 = (pQVar3->d).ptr;
    local_98 = (pQVar3->d).size;
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_a8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_a8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pWVar1 = (this->d).d;
    pDVar4 = (pWVar1->imageLocations).d.d;
    this_01 = &pWVar1->imageLocations;
    if ((pDVar4 == (Data *)0x0) ||
       (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QArrayDataPointer<QString>::reallocateAndGrow
                (&this_01->d,GrowsAtEnd,0,(QArrayDataPointer<QString> *)0x0);
    }
    QtPrivate::QGenericArrayOps<QString>::eraseFirst((QGenericArrayOps<QString> *)this_01);
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (QString *)0x0;
    local_c8.size = 0;
    QVar6.m_data = (storage_type *)0x5;
    QVar6.m_size = (qsizetype)&local_e0;
    QString::fromUtf8(QVar6);
    local_48.d.d = (Data *)local_e0.d;
    local_48.d.ptr = (char16_t *)local_e0.ptr;
    local_48.d.size = local_e0.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_c8,local_c8.size,&local_48);
    QVar7.m_data = (storage_type *)0x6;
    QVar7.m_size = (qsizetype)&local_e0;
    QString::fromUtf8(QVar7);
    local_68.d.d = (Data *)local_e0.d;
    local_68.d.ptr = (char16_t *)local_e0.ptr;
    local_68.d.size = local_e0.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_c8,local_c8.size,&local_68);
    QVar8.m_data = (storage_type *)0x5;
    QVar8.m_size = (qsizetype)&local_e0;
    QString::fromUtf8(QVar8);
    local_90._8_8_ = local_e0.d;
    pQStack_80 = local_e0.ptr;
    local_78 = local_e0.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_c8,local_c8.size,(QString *)(local_90 + 8));
    local_90._0_8_ = &((this->d).d)->imageLocations;
    this_00 = (QtConcurrent *)QThreadPool::globalInstance();
    QtConcurrent::
    run<QList<QString>(&)(QString_const&,QList<QString>const&,QList<QString>*),QString_const&,QList<QString>&,QList<QString>*>
              ((QFuture<QList<QString>_> *)local_28,this_00,(QThreadPool *)findFiles,
               (_func_QList<QString>_QString_ptr_QList<QString>_ptr_QList<QString>_ptr *)&local_a8,
               (QString *)&local_c8,(QList<QString> *)local_90,in_stack_ffffffffffffff18);
    local_e0.ptr = local_20;
    local_20 = (QString *)0x0;
    local_e0.d = (Data *)&PTR__QFutureInterface_001a2300;
    QFutureInterfaceBase::swap((QFutureInterfaceBase *)&((this->d).d)->fileFuture);
    QFutureInterface<QList<QString>_>::~QFutureInterface
              ((QFutureInterface<QList<QString>_> *)&local_e0);
    QFutureInterface<QList<QString>_>::~QFutureInterface
              ((QFutureInterface<QList<QString>_> *)local_28);
    if ((QArrayData *)local_90._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_90._8_8_,2,8);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
    pWVar1 = (this->d).d;
    pQVar5 = pWVar1->filesFutureWatcher;
    if (*(long *)&(pWVar1->fileFuture).d.field_0x8 != *(long *)&(pQVar5->m_future).d.field_0x8) {
      QFutureWatcherBase::disconnectOutputInterface(SUB81(pQVar5,0));
      QFutureInterface<QList<QString>_>::operator=(&(pQVar5->m_future).d,&(pWVar1->fileFuture).d);
      QFutureWatcherBase::connectOutputInterface();
    }
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,8);
      }
    }
  }
  return;
}

Assistant:

void
Window::_q_filesFound()
{
	const bool start = d->imageFiles.isEmpty();

	d->imageFiles += d->fileFuture.result();

	if( start )
		d->loadImages();

	if( !d->imageLocations.isEmpty() )
	{
		const QString path = d->imageLocations.at( 0 );
		d->imageLocations.removeFirst();

		d->fileFuture = QtConcurrent::run(
			findFiles, path,
			QStringList() << "*.jpg" << "*.jpeg" << "*.png",
			&d->imageLocations );

		d->filesFutureWatcher->setFuture( d->fileFuture );
	}
}